

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::TxOutRequest::TxOutRequest(TxOutRequest *this)

{
  allocator local_25 [20];
  allocator local_11;
  TxOutRequest *local_10;
  TxOutRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::TxOutRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::TxOutRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::TxOutRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__TxOutRequest_01b3a788;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->address_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->amount_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->direct_locking_script_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  CollectFieldName();
  return;
}

Assistant:

TxOutRequest() {
    CollectFieldName();
  }